

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O0

Offset<reflection::RPCCall>
reflection::CreateRPCCall
          (FlatBufferBuilder *_fbb,Offset<flatbuffers::String> name,
          Offset<reflection::Object> request,Offset<reflection::Object> response,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
          attributes,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          documentation)

{
  Offset<reflection::RPCCall> OVar1;
  undefined1 local_38 [8];
  RPCCallBuilder builder_;
  FlatBufferBuilder *_fbb_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
  documentation_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
  attributes_local;
  Offset<reflection::Object> response_local;
  Offset<reflection::Object> request_local;
  Offset<flatbuffers::String> name_local;
  
  builder_._8_8_ = _fbb;
  RPCCallBuilder::RPCCallBuilder((RPCCallBuilder *)local_38,_fbb);
  RPCCallBuilder::add_documentation((RPCCallBuilder *)local_38,documentation);
  RPCCallBuilder::add_attributes((RPCCallBuilder *)local_38,attributes);
  RPCCallBuilder::add_response((RPCCallBuilder *)local_38,response);
  RPCCallBuilder::add_request((RPCCallBuilder *)local_38,request);
  RPCCallBuilder::add_name((RPCCallBuilder *)local_38,name);
  OVar1 = RPCCallBuilder::Finish((RPCCallBuilder *)local_38);
  return (Offset<reflection::RPCCall>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<RPCCall> CreateRPCCall(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<reflection::Object> request = 0,
    ::flatbuffers::Offset<reflection::Object> response = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::KeyValue>>> attributes = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> documentation = 0) {
  RPCCallBuilder builder_(_fbb);
  builder_.add_documentation(documentation);
  builder_.add_attributes(attributes);
  builder_.add_response(response);
  builder_.add_request(request);
  builder_.add_name(name);
  return builder_.Finish();
}